

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O1

bool google::Demangle(char *mangled,char *out,int out_size)

{
  long lVar1;
  char *pcVar2;
  bool bVar3;
  byte bVar4;
  long lVar5;
  char *pcVar6;
  char cVar7;
  State state;
  State local_38;
  
  local_38.out_end = out + out_size;
  local_38.prev_name = (char *)0x0;
  local_38.prev_name_length = -1;
  local_38.nest_level = -1;
  local_38.append = true;
  local_38.overflowed = false;
  if ((*mangled == '_') && (mangled[1] == 'Z')) {
    local_38.mangled_cur = mangled + 2;
    local_38.out_cur = out;
    local_38.out_begin = out;
    bVar3 = ParseEncoding(&local_38);
    if (bVar3) {
      cVar7 = *local_38.mangled_cur;
      bVar4 = 1;
      if (cVar7 == '\0') goto LAB_00111b81;
      if (cVar7 == '@') {
        MaybeAppend(&local_38,local_38.mangled_cur);
        bVar4 = 1;
        goto LAB_00111b81;
      }
      if (cVar7 == '.') {
        lVar5 = 0;
        pcVar6 = local_38.mangled_cur;
        do {
          bVar4 = 1;
          if (0x19 < (byte)((pcVar6[1] & 0xdfU) + 0xbf)) {
LAB_00111b66:
            cVar7 = '\x01';
            break;
          }
          lVar1 = lVar5 + 3;
          pcVar2 = local_38.mangled_cur + lVar5 + 3;
          do {
            pcVar6 = pcVar2;
            lVar5 = lVar1;
            lVar1 = lVar5 + 1;
            pcVar2 = pcVar6 + 1;
          } while ((byte)((local_38.mangled_cur[lVar5 + -1] & 0xdfU) + 0xbf) < 0x1a);
          if ((local_38.mangled_cur[lVar5 + -1] != 0x2e) ||
             (9 < (byte)(local_38.mangled_cur[lVar5] - 0x30U))) goto LAB_00111b66;
          do {
            cVar7 = pcVar6[1];
            pcVar6 = pcVar6 + 1;
            lVar5 = lVar5 + 1;
          } while ((byte)(cVar7 - 0x30U) < 10);
        } while (cVar7 == '.');
        if (cVar7 == '\0') goto LAB_00111b81;
      }
    }
  }
  bVar4 = 0;
LAB_00111b81:
  return (bool)((local_38.overflowed ^ 1U) & bVar4);
}

Assistant:

static void InitState(State *state, const char *mangled,
                      char *out, int out_size) {
  state->mangled_cur = mangled;
  state->out_cur = out;
  state->out_begin = out;
  state->out_end = out + out_size;
  state->prev_name  = NULL;
  state->prev_name_length = -1;
  state->nest_level = -1;
  state->append = true;
  state->overflowed = false;
}